

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_frEfr.cpp
# Opt level: O2

void DronePoseLib::ValtonenOrnhagArxiv2021::fast_eigenvector_solver
               (double *eigv,int neig,Matrix<double,_11,_11,_0,_11,_11> *AM,MatrixXcd *sols)

{
  double dVar1;
  DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>,_1> *this;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  XprTypeNested pMVar5;
  variable_if_dynamic<long,__1> vVar6;
  variable_if_dynamic<long,__1> vVar7;
  int j;
  Scalar *pSVar8;
  ulong col;
  ulong uVar9;
  int *piVar10;
  int i;
  long lVar11;
  double zi [5];
  undefined1 local_6c8 [16];
  XprTypeNested local_6b8;
  variable_if_dynamic<long,__1> vStack_6b0;
  variable_if_dynamic<long,__1> local_6a8;
  XprTypeNested pMStack_6a0;
  scalar_constant_op<double> *local_690;
  double *local_688;
  double *local_680;
  DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>,_1> *local_678;
  double local_670;
  Vector2d s;
  variable_if_dynamic<long,__1> vStack_638;
  variable_if_dynamic<long,__1> local_630;
  double dStack_628;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  local_618;
  scalar_constant_op<double> local_608;
  PointerType pdStack_600;
  long local_5f8;
  XprTypeNested pMStack_5f0;
  undefined1 local_5c8 [16];
  XprTypeNested local_5b8;
  variable_if_dynamic<long,__1> vStack_5b0;
  variable_if_dynamic<long,__1> local_5a8;
  double dStack_5a0;
  undefined1 local_598 [40];
  XprTypeNested local_570;
  variable_if_dynamic<long,__1> vStack_568;
  variable_if_dynamic<long,__1> local_560;
  XprTypeNested pMStack_558;
  undefined1 local_540 [40];
  XprTypeNested pMStack_518;
  variable_if_dynamic<long,__1> vStack_510;
  variable_if_dynamic<long,__1> local_508;
  double dStack_500;
  Matrix3d AA;
  BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> local_4a8;
  BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> local_478;
  BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> local_448;
  BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> local_418;
  undefined1 local_3e8 [40];
  XprTypeNested local_3c0;
  variable_if_dynamic<long,__1> vStack_3b8;
  variable_if_dynamic<long,__1> local_3b0;
  double dStack_3a8;
  long local_3a0;
  XprTypeNested pMStack_398;
  double local_378;
  XprTypeNested local_370;
  XprTypeNested pMStack_368;
  XprTypeNested local_360;
  double dStack_358;
  double local_350;
  double dStack_348;
  XprTypeNested local_320;
  double local_318 [8];
  undefined1 local_2d8 [40];
  scalar_constant_op<double> local_2b0;
  PointerType pdStack_2a8;
  XprTypeNested local_2a0;
  variable_if_dynamic<long,__1> vStack_298;
  variable_if_dynamic<long,__1> local_290;
  variable_if_dynamic<long,__1> vStack_288;
  double dStack_280;
  scalar_constant_op<double> local_268;
  scalar_constant_op<double> local_260;
  XprTypeNested pMStack_258;
  XprTypeNested local_250;
  variable_if_dynamic<long,__1> vStack_248;
  variable_if_dynamic<long,__1> local_240;
  variable_if_dynamic<long,__1> vStack_238;
  XprTypeNested pMStack_230;
  scalar_constant_op<double> local_210;
  scalar_constant_op<double> local_208;
  XprTypeNested pMStack_200;
  XprTypeNested local_1f8;
  variable_if_dynamic<long,__1> vStack_1f0;
  variable_if_dynamic<long,__1> local_1e8;
  variable_if_dynamic<long,__1> vStack_1e0;
  double dStack_1d8;
  PointerType local_1c0;
  LhsNested LStack_1b8;
  variable_if_dynamic<long,__1> vStack_1a8;
  variable_if_dynamic<long,__1> local_1a0;
  XprTypeNested pMStack_198;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_168;
  Matrix<double,_3,_11,_0,_3,_11> AMs;
  
  piVar10 = fast_eigenvector_solver::ind;
  local_680 = eigv;
  local_678 = (DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>,_1> *)sols;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    Eigen::Block<const_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
              ((Block<const_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false> *)local_2d8,AM,
               (long)*piVar10);
    Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_1,_11,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_1,_11,_false> *)local_3e8,&AMs,lVar11)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,1,11,false>,Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>const,1,11,false>>
              ((Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_1,_11,_false> *)local_3e8,
               (Block<const_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false> *)local_2d8);
    piVar10 = piVar10 + 1;
  }
  local_690 = &local_208;
  local_688 = local_318;
  col = 0;
  uVar9 = (ulong)(uint)neig;
  if (neig < 1) {
    uVar9 = col;
  }
  for (; col != uVar9; col = col + 1) {
    zi[0] = local_680[col];
    dVar1 = zi[0];
    for (lVar11 = 1; lVar11 != 5; lVar11 = lVar11 + 1) {
      dVar1 = dVar1 * zi[0];
      zi[lVar11] = dVar1;
    }
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> *)
                    local_6c8,&AMs,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_3e8,zi + 3,(StorageBaseType *)local_6c8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> *)
                    local_5c8,&AMs,2);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_598,zi + 2,(StorageBaseType *)local_5c8);
    dVar1 = dStack_3a8;
    vVar7.m_value = local_3b0.m_value;
    vVar6.m_value = vStack_3b8.m_value;
    pMVar5 = local_3c0;
    uVar4 = local_3e8._16_8_;
    uVar3 = local_598._16_8_;
    s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (double)local_3e8._24_8_;
    s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (double)local_3e8._32_8_;
    local_618.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> *)local_598._24_8_;
    local_618.m_rhs =
         (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
          *)local_598._32_8_;
    local_608.m_other = (double)local_570;
    pdStack_600 = (PointerType)vStack_568.m_value;
    local_5f8 = local_560.m_value;
    pMStack_5f0 = pMStack_558;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_418,&AMs,4);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_540,zi + 1,(StorageBaseType *)&local_418);
    local_2d8._32_8_ = uVar4;
    local_290.m_value = vVar7.m_value;
    vStack_288.m_value = (long)dVar1;
    local_2a0 = pMVar5;
    vStack_298.m_value = vVar6.m_value;
    local_2b0.m_other =
         s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    pdStack_2a8 = (PointerType)
                  s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                  array[1];
    local_268.m_other = (double)uVar3;
    local_240.m_value = local_5f8;
    vStack_238.m_value = (long)pMStack_5f0;
    local_250 = (XprTypeNested)local_608.m_other;
    vStack_248.m_value = (long)pdStack_600;
    local_260.m_other = (double)local_618.m_dec;
    pMStack_258 = (XprTypeNested)local_618.m_rhs;
    local_210.m_other = (double)local_540._16_8_;
    local_690[4].m_other = (double)local_508.m_value;
    local_690[5].m_other = dStack_500;
    local_690[2].m_other = (double)pMStack_518;
    local_690[3].m_other = (double)vStack_510.m_value;
    local_690->m_other = (double)local_540._24_8_;
    local_690[1].m_other = (double)local_540._32_8_;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    &local_478,&AA,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_478,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                *)local_2d8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_418,&AMs,1);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_598,zi + 3,(StorageBaseType *)&local_418);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_478,&AMs,3);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_540,zi + 2,(StorageBaseType *)&local_478);
    uVar4 = local_540._16_8_;
    uVar3 = local_598._16_8_;
    local_6c8._0_8_ = local_598._24_8_;
    local_6c8._8_8_ = local_598._32_8_;
    local_6b8 = local_570;
    vStack_6b0.m_value = vStack_568.m_value;
    local_6a8.m_value = local_560.m_value;
    pMStack_6a0 = pMStack_558;
    local_5c8._0_8_ = local_540._24_8_;
    local_5c8._8_8_ = local_540._32_8_;
    local_5b8 = pMStack_518;
    vStack_5b0.m_value = vStack_510.m_value;
    local_5a8.m_value = local_508.m_value;
    dStack_5a0 = dStack_500;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4a8,&AMs,6);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)&s,zi + 1,(StorageBaseType *)&local_4a8);
    local_3e8._32_8_ = uVar3;
    local_3a0 = local_6a8.m_value;
    pMStack_398 = pMStack_6a0;
    local_3b0.m_value = (long)local_6b8;
    dStack_3a8 = (double)vStack_6b0.m_value;
    local_3c0 = (XprTypeNested)local_6c8._0_8_;
    vStack_3b8.m_value = local_6c8._8_8_;
    local_378 = (double)uVar4;
    local_350 = (double)local_5a8.m_value;
    dStack_348 = dStack_5a0;
    local_360 = local_5b8;
    dStack_358 = (double)vStack_5b0.m_value;
    local_370 = (XprTypeNested)local_5c8._0_8_;
    pMStack_368 = (XprTypeNested)local_5c8._8_8_;
    local_320 = pMVar5;
    local_688[4] = (double)local_630.m_value;
    local_688[5] = dStack_628;
    local_688[2] = dVar1;
    local_688[3] = (double)vStack_638.m_value;
    *local_688 = (double)vVar6.m_value;
    local_688[1] = (double)vVar7.m_value;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_448,&AMs,8);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)&local_618,zi,(StorageBaseType *)&local_448);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)local_2d8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
                 *)local_3e8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_618);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_168,&AA,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_168,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                *)local_2d8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true> *)
                    local_5c8,&AMs,5);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_3e8,zi + 2,(StorageBaseType *)local_5c8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_418,&AMs,7);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_598,zi + 1,(StorageBaseType *)&local_418);
    dVar1 = dStack_3a8;
    vVar7.m_value = local_3b0.m_value;
    vVar6.m_value = vStack_3b8.m_value;
    pMVar5 = local_3c0;
    uVar4 = local_3e8._16_8_;
    uVar3 = local_598._16_8_;
    s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (double)local_3e8._24_8_;
    s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (double)local_3e8._32_8_;
    local_618.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> *)local_598._24_8_;
    local_618.m_rhs =
         (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
          *)local_598._32_8_;
    local_608.m_other = (double)local_570;
    pdStack_600 = (PointerType)vStack_568.m_value;
    local_5f8 = local_560.m_value;
    pMStack_5f0 = pMStack_558;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_478,&AMs,9);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                      *)local_540,zi,(StorageBaseType *)&local_478);
    local_670 = (double)local_540._16_8_;
    local_6c8._0_8_ = local_540._24_8_;
    local_6c8._8_8_ = local_540._32_8_;
    local_6b8 = pMStack_518;
    vStack_6b0.m_value = vStack_510.m_value;
    local_6a8.m_value = local_508.m_value;
    pMStack_6a0 = (XprTypeNested)dStack_500;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_4a8,&AMs,10);
    local_2b0.m_other = (double)uVar4;
    vStack_288.m_value = vVar7.m_value;
    dStack_280 = dVar1;
    vStack_298.m_value = (long)pMVar5;
    local_290.m_value = vVar6.m_value;
    pdStack_2a8 = (PointerType)
                  s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                  array[0];
    local_2a0 = (XprTypeNested)
                s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                array[1];
    local_260.m_other = (double)uVar3;
    vStack_238.m_value = local_5f8;
    pMStack_230 = pMStack_5f0;
    vStack_248.m_value = (long)local_608.m_other;
    local_240.m_value = (long)pdStack_600;
    pMStack_258 = (XprTypeNested)local_618.m_dec;
    local_250 = (XprTypeNested)local_618.m_rhs;
    local_208.m_other = local_670;
    vStack_1e0.m_value = local_6a8.m_value;
    dStack_1d8 = (double)pMStack_6a0;
    vStack_1f0.m_value = (long)local_6b8;
    local_1e8.m_value = vStack_6b0.m_value;
    pMStack_200 = (XprTypeNested)local_6c8._0_8_;
    local_1f8 = (XprTypeNested)local_6c8._8_8_;
    local_1a0.m_value = local_4a8.m_startCol.m_value;
    pMStack_198 = (XprTypeNested)local_4a8.m_outerStride;
    LStack_1b8.m_functor.m_other = (double)local_4a8.m_xpr;
    vStack_1a8.m_value = local_4a8.m_startRow.m_value;
    local_1c0 = local_4a8.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>,_0>.
                m_data;
    LStack_1b8._0_8_ =
         local_4a8.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>,_0>._8_8_;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    &local_448,(Matrix<double,_3,_3,_0,_3,_3> *)&AA,2);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_448,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
                *)local_2d8);
    AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] -
         zi[4];
    AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] -
         zi[4];
    AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] -
         zi[3];
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::leftCols<int>
              ((Type *)local_3e8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&AA,2);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_-1,_true>_>::
    colPivHouseholderQr((ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> *)local_2d8,
                        (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,__1,_true>_>
                         *)local_3e8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_540,(Matrix<double,_3,_3,_0,_3,_3> *)&AA,2);
    local_598._32_8_ = local_540._32_8_;
    local_570 = pMStack_518;
    local_598._16_8_ = local_540._16_8_;
    local_598._24_8_ = local_540._24_8_;
    local_598._0_8_ = local_540._0_8_;
    local_598._8_8_ = local_540._8_8_;
    local_618 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,-1,0,3,3>>>::
                solve<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>
                          ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>>>
                            *)local_2d8,
                           (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                            *)local_598);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&s,
               (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
                *)&local_618);
    this = local_678;
    dVar1 = zi[0];
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>,_1>::
             operator()(local_678,0,col);
    dVar2 = s.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
    ;
    *(double *)pSVar8->_M_value = dVar1;
    *(undefined8 *)(pSVar8->_M_value + 8) = 0;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>,_1>::
             operator()(this,1,col);
    *(double *)pSVar8->_M_value = dVar2;
    *(undefined8 *)(pSVar8->_M_value + 8) = 0;
  }
  return;
}

Assistant:

inline void fast_eigenvector_solver(
    double *eigv,
    int neig,
    const Eigen::Matrix<double, 11, 11> &AM,
    Eigen::MatrixXcd *sols) {
    static const int ind[] = {0, 1, 5};
    // Truncated action matrix containing non-trivial rows
    Eigen::Matrix<double, 3, 11> AMs;
    double zi[5];

    for (int i = 0; i < 3; i++) {
        AMs.row(i) = AM.row(ind[i]);
    }
    for (int i = 0; i < neig; i++) {
        zi[0] = eigv[i];
        for (int j = 1; j < 5; j++) {
            zi[j] = zi[j - 1] * eigv[i];
        }
        Eigen::Matrix3d AA;
        AA.col(0) = zi[3] * AMs.col(0) + zi[2] * AMs.col(2) + zi[1] * AMs.col(4);
        AA.col(1) = zi[3] * AMs.col(1) + zi[2] * AMs.col(3) + zi[1] * AMs.col(6) + zi[0] * AMs.col(8);
        AA.col(2) = zi[2] * AMs.col(5) + zi[1] * AMs.col(7) + zi[0] * AMs.col(9) + AMs.col(10);
        AA(0, 0) = AA(0, 0) - zi[4];
        AA(1, 1) = AA(1, 1) - zi[4];
        AA(2, 2) = AA(2, 2) - zi[3];

        Eigen::Vector2d s = AA.leftCols(2).colPivHouseholderQr().solve(-AA.col(2));
        (*sols)(0, i) = zi[0];
        (*sols)(1, i) = s(1);
    }
}